

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O2

void __thiscall
duckdb::ChimpScanState<double>::ChimpScanState(ChimpScanState<double> *this,ColumnSegment *segment)

{
  BufferHandle *this_00;
  idx_t iVar1;
  BufferManager *pBVar2;
  data_ptr_t pdVar3;
  BufferHandle BStack_38;
  
  (this->super_SegmentScanState)._vptr_SegmentScanState =
       (_func_int **)&PTR__ChimpScanState_01782e00;
  this_00 = &this->handle;
  BufferHandle::BufferHandle(this_00);
  this->total_value_count = 0;
  (this->group_state).chimp_state.input.input = (uint8_t *)0x0;
  (this->group_state).chimp_state.input.index = 0;
  switchD_0049f7f1::default(&(this->group_state).chimp_state.reference_value,0,0x20410);
  (this->group_state).chimp_state.first = true;
  (this->group_state).chimp_state.leading_zeros = 0xff;
  (this->group_state).chimp_state.trailing_zeros = '\0';
  this->segment = segment;
  this->segment_count =
       (segment->super_SegmentBase<duckdb::ColumnSegment>).count.super___atomic_base<unsigned_long>.
       _M_i;
  pBVar2 = BufferManager::GetBufferManager(segment->db);
  (*pBVar2->_vptr_BufferManager[7])(&BStack_38,pBVar2,&segment->block);
  BufferHandle::operator=(this_00,&BStack_38);
  BufferHandle::~BufferHandle(&BStack_38);
  pdVar3 = BufferHandle::Ptr(this_00);
  iVar1 = segment->offset;
  (this->group_state).chimp_state.input.input = pdVar3 + iVar1 + 4;
  (this->group_state).chimp_state.input.index = 0;
  (this->group_state).chimp_state.leading_zeros = 0xff;
  (this->group_state).chimp_state.trailing_zeros = '\0';
  (this->group_state).chimp_state.reference_value = 0;
  (this->group_state).chimp_state.ring_buffer.index = 0;
  (this->group_state).chimp_state.first = true;
  (this->group_state).index = 0;
  this->metadata_ptr = pdVar3 + *(uint *)(pdVar3 + iVar1) + iVar1;
  return;
}

Assistant:

explicit ChimpScanState(ColumnSegment &segment) : segment(segment), segment_count(segment.count) {
		auto &buffer_manager = BufferManager::GetBufferManager(segment.db);

		handle = buffer_manager.Pin(segment.block);
		auto dataptr = handle.Ptr();
		// ScanStates never exceed the boundaries of a Segment,
		// but are not guaranteed to start at the beginning of the Block
		auto start_of_data_segment = dataptr + segment.GetBlockOffset() + ChimpPrimitives::HEADER_SIZE;
		group_state.Init(start_of_data_segment);
		auto metadata_offset = Load<uint32_t>(dataptr + segment.GetBlockOffset());
		metadata_ptr = dataptr + segment.GetBlockOffset() + metadata_offset;
	}